

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void __thiscall QWhatsThisPrivate::~QWhatsThisPrivate(QWhatsThisPrivate *this)

{
  QWhatsThisPrivate *in_RDI;
  
  ~QWhatsThisPrivate(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

QWhatsThisPrivate::~QWhatsThisPrivate()
{
#if QT_CONFIG(action)
    if (action)
        action->setChecked(false);
#endif // QT_CONFIG(action)
#ifndef QT_NO_CURSOR
    QGuiApplication::restoreOverrideCursor();
#endif
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::ContextHelpEnd);
    QAccessible::updateAccessibility(&event);
#endif
    instance = nullptr;
}